

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_add_clip(nk_draw_list *list,nk_rect rect)

{
  nk_buffer *pnVar1;
  void *pvVar2;
  int *piVar3;
  nk_handle *pnVar4;
  nk_size nVar5;
  
  if (list == (nk_draw_list *)0x0) {
    return;
  }
  if (list->cmd_count == 0) {
    pnVar4 = &(list->config).null.texture;
  }
  else {
    pnVar1 = list->buffer;
    if (pnVar1 == (nk_buffer *)0x0) {
      pvVar2 = (void *)0x0;
      nVar5 = 0;
    }
    else {
      pvVar2 = (pnVar1->memory).ptr;
      nVar5 = (pnVar1->memory).size;
    }
    piVar3 = (int *)((long)pvVar2 +
                    (ulong)(list->cmd_count - 1) * -0x20 + (nVar5 - list->cmd_offset));
    if (*piVar3 == 0) {
      *(nk_rect *)(piVar3 + 1) = rect;
    }
    pnVar4 = (nk_handle *)(piVar3 + 6);
  }
  nk_draw_list_push_command(list,rect,*pnVar4);
  return;
}

Assistant:

NK_INTERN void
nk_draw_list_add_clip(struct nk_draw_list *list, struct nk_rect rect)
{
NK_ASSERT(list);
if (!list) return;
if (!list->cmd_count) {
nk_draw_list_push_command(list, rect, list->config.null.texture);
} else {
struct nk_draw_command *prev = nk_draw_list_command_last(list);
if (prev->elem_count == 0)
prev->clip_rect = rect;
nk_draw_list_push_command(list, rect, prev->texture);
}
}